

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

size_t ON_SubDMeshFragment::SizeofFragment(uint display_density)

{
  uint uVar1;
  size_t sizeof_doubles;
  size_t doubles_per_vertex;
  size_t sz;
  uint vertex_capacity;
  uint side_seg_count;
  uint display_density_local;
  
  if (display_density < 7) {
    uVar1 = SideSegmentCountFromDisplayDensity(display_density);
    if (uVar1 == 0) {
      ON_SubDIncrementErrorCount();
      _side_seg_count = 0;
    }
    else {
      for (doubles_per_vertex = 0x248; (doubles_per_vertex & 7) != 0;
          doubles_per_vertex = doubles_per_vertex + 1) {
      }
      _side_seg_count = (ulong)((uVar1 + 1) * (uVar1 + 1)) * 0x60 + doubles_per_vertex;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    _side_seg_count = 0;
  }
  return _side_seg_count;
}

Assistant:

size_t ON_SubDMeshFragment::SizeofFragment(
  unsigned int display_density
)
{
  if (display_density > ON_SubDDisplayParameters::MaximumDensity)
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned side_seg_count = ON_SubDMeshFragment::SideSegmentCountFromDisplayDensity(display_density);
  if (side_seg_count < 1)
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned vertex_capacity = (side_seg_count + 1)*(side_seg_count + 1);
  size_t sz = sizeof(ON_SubDMeshFragment);
  while (0 != (sz % sizeof(double)))
    ++sz;

  const size_t doubles_per_vertex
    = 3 // 3d points in m_P[]
    + 3 // 3d vectors in m_N[]
    + 3 // 3d points in m_T[]
    + 1 // a color in m_C[] (note that sizeof(m_C[0]) <= sizeof(double)
    + sizeof(ON_SurfaceCurvature)/sizeof(double) // 2 doubles in ON_SurfaceCurvature
    ;

  const size_t sizeof_doubles = doubles_per_vertex * sizeof(double);
  sz += vertex_capacity * sizeof_doubles;
  return sz;
}